

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O1

optional<unsigned_long> __thiscall graph_utils::Dsu<int>::Size(Dsu<int> *this,int *u)

{
  _Base_ptr p_Var1;
  _Storage<int,_true> _Var2;
  optional<int> oVar3;
  _Storage<unsigned_long,_true> in_RCX;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  optional<unsigned_long> oVar6;
  
  oVar3 = Find(this,u);
  if (((ulong)oVar3.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> & 0x100000000) != 0) {
    p_Var5 = &(this->size_)._M_t._M_impl.super__Rb_tree_header._M_header;
    _Var2._M_value =
         oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
         _M_payload;
    p_Var4 = p_Var5;
    for (p_Var1 = (this->size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var1 != (_Base_ptr)0x0;
        p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < _Var2._M_value]) {
      if (_Var2._M_value <= (int)p_Var1[1]._M_color) {
        p_Var4 = p_Var1;
      }
    }
    if ((p_Var4 != p_Var5) && ((int)p_Var4[1]._M_color <= _Var2._M_value)) {
      p_Var5 = p_Var4;
    }
    in_RCX = (_Storage<unsigned_long,_true>)p_Var5[1]._M_parent;
  }
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ =
       ((ulong)oVar3.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int> & 0x100000000) >> 0x20;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = in_RCX._M_value;
  return (optional<unsigned_long>)
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> Size(const Type& u) {
    if (auto u_rep = Find(u))
      return size_.find(*u_rep)->second;
    return {};
  }